

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_test.cc
# Opt level: O3

void leveldb::ThreadBody(void *arg)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)arg);
  if (iVar1 == 0) {
    *(ulong *)((long)arg + 0x60) =
         CONCAT44((int)((ulong)*(undefined8 *)((long)arg + 0x60) >> 0x20) + -1,
                  (int)*(undefined8 *)((long)arg + 0x60) + 1);
    std::condition_variable::notify_one();
    pthread_mutex_unlock((pthread_mutex_t *)arg);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

static void ThreadBody(void* arg) {
  State* s = reinterpret_cast<State*>(arg);
  s->mu.Lock();
  s->val += 1;
  s->num_running -= 1;
  s->cvar.Signal();
  s->mu.Unlock();
}